

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::generateDES
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  SoftHSM *pSVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  Session *this_00;
  SymmetricKey *pSVar9;
  CryptoFactory *pCVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  long *plVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CK_ULONG CVar13;
  CK_ULONG CVar14;
  _func_int **pp_Var15;
  unsigned_long *puVar16;
  CK_OBJECT_HANDLE_PTR pCVar17;
  uint uVar18;
  CK_RV CVar19;
  bool bVar20;
  ByteString kcv;
  ByteString value;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_ATTRIBUTE keyAttribs [32];
  CK_BBOOL local_6e9;
  Token *local_6e8;
  long *local_6e0;
  SymmetricKey *local_6d8;
  SoftHSM *local_6d0;
  uint local_6c4;
  CK_OBJECT_HANDLE_PTR local_6c0;
  ByteString local_6b8;
  ByteString local_690;
  undefined8 local_668;
  undefined8 local_660;
  undefined1 local_658 [160];
  OSAttribute local_5b8;
  OSAttribute local_518;
  OSAttribute local_478;
  OSAttribute local_3d8;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  local_6e9 = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    CVar19 = 0xb3;
  }
  else {
    local_6e8 = Session::getToken(this_00);
    CVar19 = 5;
    if (local_6e8 != (Token *)0x0) {
      local_6d0 = this;
      if (ulCount == 0) {
        uVar18 = 1;
      }
      else {
        puVar16 = &pTemplate->ulValueLen;
        uVar18 = 1;
        CVar13 = ulCount;
        do {
          if (((_CK_ATTRIBUTE *)(puVar16 + -2))->type == 0x90) {
            if (*puVar16 != 0) {
              softHSMLog(6,"generateDES",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x1ee1,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
              return 0x13;
            }
            uVar18 = 0;
          }
          puVar16 = puVar16 + 3;
          CVar13 = CVar13 - 1;
        } while (CVar13 != 0);
      }
      pSVar9 = (SymmetricKey *)operator_new(0x38);
      SymmetricKey::SymmetricKey(pSVar9,0x38);
      (pSVar9->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019d2f0;
      pCVar10 = CryptoFactory::i();
      iVar8 = (**pCVar10->_vptr_CryptoFactory)(pCVar10,2);
      local_6e0 = (long *)CONCAT44(extraout_var,iVar8);
      if (local_6e0 == (long *)0x0) {
        softHSMLog(3,"generateDES",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1ef0,"Could not get SymmetricAlgorithm");
        (*(pSVar9->super_Serialisable)._vptr_Serialisable[2])(pSVar9);
      }
      else {
        local_6d8 = pSVar9;
        pCVar10 = CryptoFactory::i();
        iVar8 = (*pCVar10->_vptr_CryptoFactory[8])(pCVar10,1);
        pSVar9 = local_6d8;
        plVar12 = local_6e0;
        if (CONCAT44(extraout_var_00,iVar8) == 0) {
          softHSMLog(3,"generateDES",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x1ef7,"Could not get RNG");
          plVar12 = local_6e0;
          (**(code **)(*local_6e0 + 0x50))(local_6e0,local_6d8);
          pCVar10 = CryptoFactory::i();
          pp_Var15 = pCVar10->_vptr_CryptoFactory;
        }
        else {
          local_6c4 = uVar18;
          cVar5 = (**(code **)(*local_6e0 + 0x58))
                            (local_6e0,local_6d8,CONCAT44(extraout_var_00,iVar8));
          if (cVar5 != '\0') {
            local_660 = 4;
            local_668 = 0x13;
            local_6c0 = phKey;
            memset(&local_338,0,0x300);
            pCVar17 = local_6c0;
            local_338.ulValueLen = 8;
            local_320 = 1;
            local_318 = &local_6e9;
            local_310 = 1;
            local_308 = 2;
            local_300 = &isPrivate;
            local_2f8 = 1;
            local_2f0 = 0x100;
            CVar19 = 0xd1;
            if (ulCount < 0x1d) {
              CVar19 = 0;
            }
            local_2e0 = 8;
            CVar13 = 4;
            uVar11 = 1;
            CVar14 = CVar13;
            if (ulCount - 1 < 0x1c) {
              do {
                uVar1 = pTemplate->type;
                CVar13 = CVar14;
                if (((2 < uVar1) && (uVar1 != 0x90)) && (uVar1 != 0x100)) {
                  CVar13 = CVar14 + 1;
                  (&local_338)[CVar14].ulValueLen = pTemplate->ulValueLen;
                  pvVar3 = pTemplate->pValue;
                  (&local_338)[CVar14].type = pTemplate->type;
                  (&local_338)[CVar14].pValue = pvVar3;
                }
                if (0x1c < ulCount) break;
                pTemplate = pTemplate + 1;
                bVar20 = uVar11 < ulCount;
                uVar11 = uVar11 + 1;
                CVar14 = CVar13;
              } while (bVar20);
            }
            local_338.pValue = &local_660;
            local_2e8 = &local_668;
            if (ulCount < 0x1d) {
              CVar19 = CreateObject(local_6d0,hSession,&local_338,CVar13,local_6c0,4);
            }
            pSVar9 = local_6d8;
            if (CVar19 == 0) {
              plVar12 = (long *)HandleManager::getObject(local_6d0->handleManager,*pCVar17);
              CVar19 = 6;
              if (((plVar12 != (long *)0x0) &&
                  (cVar5 = (**(code **)(*plVar12 + 0x50))(plVar12), cVar5 != '\0')) &&
                 (cVar5 = (**(code **)(*plVar12 + 0x58))(plVar12,1), cVar5 != '\0')) {
                OSAttribute::OSAttribute(&local_5b8,true);
                cVar5 = (**(code **)(*plVar12 + 0x40))(plVar12,0x163,&local_5b8);
                OSAttribute::~OSAttribute(&local_5b8);
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_5b8,0x120);
                  cVar5 = (**(code **)(*plVar12 + 0x40))(plVar12,0x166,&local_5b8);
                  OSAttribute::~OSAttribute(&local_5b8);
                }
                cVar6 = '\0';
                bVar20 = (bool)(**(code **)(*plVar12 + 0x20))(plVar12,0x103,0);
                if (cVar5 != '\0') {
                  OSAttribute::OSAttribute(&local_3d8,bVar20);
                  cVar6 = (**(code **)(*plVar12 + 0x40))(plVar12,0x165,&local_3d8);
                  OSAttribute::~OSAttribute(&local_3d8);
                }
                cVar5 = '\0';
                bVar7 = (**(code **)(*plVar12 + 0x20))(plVar12,0x162,0);
                if (cVar6 != '\0') {
                  OSAttribute::OSAttribute(&local_478,(bool)(bVar7 ^ 1));
                  cVar5 = (**(code **)(*plVar12 + 0x40))(plVar12,0x164,&local_478);
                  OSAttribute::~OSAttribute(&local_478);
                }
                ByteString::ByteString(&local_690);
                ByteString::ByteString(&local_6b8);
                p_Var2 = (pSVar9->super_Serialisable)._vptr_Serialisable[4];
                if (isPrivate == '\0') {
                  iVar8 = (*p_Var2)(pSVar9);
                  ByteString::operator=(&local_690,(ByteString *)CONCAT44(extraout_var_02,iVar8));
                  (*(pSVar9->super_Serialisable)._vptr_Serialisable[5])(local_658,pSVar9);
                  ByteString::operator=(&local_6b8,(ByteString *)local_658);
                }
                else {
                  iVar8 = (*p_Var2)(pSVar9);
                  Token::encrypt(local_6e8,(char *)CONCAT44(extraout_var_01,iVar8),(int)&local_690);
                  (*(pSVar9->super_Serialisable)._vptr_Serialisable[5])(local_658,pSVar9);
                  Token::encrypt(local_6e8,local_658,(int)&local_6b8);
                }
                local_658._0_8_ = &PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                           (local_658 + 8));
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute((OSAttribute *)local_658,&local_690);
                  cVar5 = (**(code **)(*plVar12 + 0x40))(plVar12,0x11,local_658);
                  OSAttribute::~OSAttribute((OSAttribute *)local_658);
                }
                if ((local_6c4 & 1) != 0) {
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_518,&local_6b8);
                    cVar5 = (**(code **)(*plVar12 + 0x40))(plVar12,0x90,&local_518);
                    OSAttribute::~OSAttribute(&local_518);
                  }
                }
                if (cVar5 == '\0') {
                  (**(code **)(*plVar12 + 0x68))(plVar12);
                  cVar5 = '\0';
                }
                else {
                  cVar5 = (**(code **)(*plVar12 + 0x60))(plVar12);
                }
                CVar19 = 6;
                if (cVar5 != '\0') {
                  CVar19 = 0;
                }
                local_6b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_6b8.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_690._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_690.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                pCVar17 = local_6c0;
              }
            }
            plVar12 = local_6e0;
            (**(code **)(*local_6e0 + 0x50))(local_6e0,pSVar9);
            pCVar10 = CryptoFactory::i();
            (*pCVar10->_vptr_CryptoFactory[1])(pCVar10,plVar12);
            pSVar4 = local_6d0;
            if (CVar19 == 0) {
              return 0;
            }
            if (*pCVar17 == 0) {
              return CVar19;
            }
            plVar12 = (long *)HandleManager::getObject(local_6d0->handleManager,*pCVar17);
            HandleManager::destroyObject(pSVar4->handleManager,*pCVar17);
            if (plVar12 != (long *)0x0) {
              (**(code **)(*plVar12 + 0x70))(plVar12);
            }
            *pCVar17 = 0;
            return CVar19;
          }
          softHSMLog(3,"generateDES",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x1efe,"Could not generate DES secret key");
          (**(code **)(*plVar12 + 0x50))(plVar12,pSVar9);
          pCVar10 = CryptoFactory::i();
          pp_Var15 = pCVar10->_vptr_CryptoFactory;
        }
        (*pp_Var15[1])(pCVar10,plVar12);
      }
      CVar19 = 5;
    }
  }
  return CVar19;
}

Assistant:

CK_RV SoftHSM::generateDES
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Generate the secret key
	DESKey* key = new DESKey(56);
	SymmetricAlgorithm* des = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::DES);
	if (des == NULL)
	{
		ERROR_MSG("Could not get SymmetricAlgorithm");
		delete key;
		return CKR_GENERAL_ERROR;
	}
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL)
	{
		ERROR_MSG("Could not get RNG");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}
	if (!des->generateKey(*key, rng))
	{
		ERROR_MSG("Could not generate DES secret key");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}

	CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_DES;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			keyAttribs[keyAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, keyAttribs, keyAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DES_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// DES Secret Key Attributes
			ByteString value;
			ByteString kcv;
			if (isPrivate)
			{
				token->encrypt(key->getKeyBits(), value);
				token->encrypt(key->getKeyCheckValue(), kcv);
			}
			else
			{
				value = key->getKeyBits();
				kcv = key->getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	des->recycleKey(key);
	CryptoFactory::i()->recycleSymmetricAlgorithm(des);

	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}